

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O1

void xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt)

{
  long lVar1;
  long lVar2;
  
  if (ctxt != (xmlXIncludeCtxtPtr)0x0) {
    if (ctxt->urlTab != (xmlXIncludeDoc *)0x0) {
      if (0 < ctxt->urlNr) {
        lVar2 = 0;
        lVar1 = 0;
        do {
          xmlFreeDoc(*(xmlDocPtr *)((long)&ctxt->urlTab->doc + lVar2));
          (*xmlFree)(*(void **)((long)&ctxt->urlTab->url + lVar2));
          lVar1 = lVar1 + 1;
          lVar2 = lVar2 + 0x18;
        } while (lVar1 < ctxt->urlNr);
      }
      (*xmlFree)(ctxt->urlTab);
    }
    if (0 < ctxt->incNr) {
      lVar1 = 0;
      do {
        if (ctxt->incTab[lVar1] != (xmlXIncludeRefPtr)0x0) {
          xmlXIncludeFreeRef(ctxt->incTab[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < ctxt->incNr);
    }
    if (ctxt->incTab != (xmlXIncludeRefPtr *)0x0) {
      (*xmlFree)(ctxt->incTab);
    }
    if (ctxt->txtTab != (xmlXIncludeTxt *)0x0) {
      if (0 < ctxt->txtNr) {
        lVar2 = 0;
        lVar1 = 0;
        do {
          (*xmlFree)(*(void **)((long)&ctxt->txtTab->text + lVar2));
          (*xmlFree)(*(void **)((long)&ctxt->txtTab->url + lVar2));
          lVar1 = lVar1 + 1;
          lVar2 = lVar2 + 0x10;
        } while (lVar1 < ctxt->txtNr);
      }
      (*xmlFree)(ctxt->txtTab);
    }
    if (ctxt->xpctxt != (xmlXPathContextPtr)0x0) {
      xmlXPathFreeContext(ctxt->xpctxt);
    }
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlXIncludeFreeContext(xmlXIncludeCtxtPtr ctxt) {
    int i;

    if (ctxt == NULL)
	return;
    if (ctxt->urlTab != NULL) {
	for (i = 0; i < ctxt->urlNr; i++) {
	    xmlFreeDoc(ctxt->urlTab[i].doc);
	    xmlFree(ctxt->urlTab[i].url);
	}
	xmlFree(ctxt->urlTab);
    }
    for (i = 0;i < ctxt->incNr;i++) {
	if (ctxt->incTab[i] != NULL)
	    xmlXIncludeFreeRef(ctxt->incTab[i]);
    }
    if (ctxt->incTab != NULL)
	xmlFree(ctxt->incTab);
    if (ctxt->txtTab != NULL) {
	for (i = 0;i < ctxt->txtNr;i++) {
	    xmlFree(ctxt->txtTab[i].text);
	    xmlFree(ctxt->txtTab[i].url);
	}
	xmlFree(ctxt->txtTab);
    }
#ifdef LIBXML_XPTR_ENABLED
    if (ctxt->xpctxt != NULL)
	xmlXPathFreeContext(ctxt->xpctxt);
#endif
    xmlFree(ctxt);
}